

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseValueTypeList(WastParser *this,TypeVector *out_type_list)

{
  iterator __position;
  TokenType TVar1;
  Token local_80;
  Type local_2c;
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    do {
      Consume(&local_80,this);
      if (local_80.token_type_ != First_Type) {
        __assert_fail("HasType()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                      ,0x66,"Type wabt::Token::type() const");
      }
      local_2c = local_80.field_2.type_;
      __position._M_current =
           (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_realloc_insert<wabt::Type>
                  (out_type_list,__position,&local_2c);
      }
      else {
        *__position._M_current = local_80.field_2.type_;
        (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      Token::~Token(&local_80);
      TVar1 = Peek(this,0);
    } while (TVar1 == First_Type);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list) {
  WABT_TRACE(ParseValueTypeList);
  while (PeekMatch(TokenType::ValueType))
    out_type_list->push_back(Consume().type());

  return Result::Ok;
}